

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3GetMatchinfo(Fts3Cursor *pCsr,char *zArg)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  u32 *puVar5;
  char *in_RSI;
  Fts3Cursor *in_RDI;
  int i;
  int nArg;
  int nMatchinfo;
  int bGlobal;
  int rc;
  Fts3Table *pTab;
  MatchInfo sInfo;
  uint in_stack_ffffffffffffffb0;
  int iVar6;
  int local_44;
  MatchInfo local_38;
  char *local_18;
  Fts3Cursor *local_10;
  
  psVar1 = (in_RDI->base).pVtab;
  local_44 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_38,0,0x20);
  local_38.pCursor = local_10;
  local_38.nCol = *(int *)&psVar1[2].pModule;
  if ((local_10->zMatchinfo != (char *)0x0) &&
     (iVar2 = strcmp(local_10->zMatchinfo,local_18), iVar2 != 0)) {
    sqlite3_free((void *)0x1cfc3a);
    local_10->zMatchinfo = (char *)0x0;
    local_10->aMatchinfo = (u32 *)0x0;
  }
  if (local_10->aMatchinfo == (u32 *)0x0) {
    iVar6 = 0;
    iVar2 = fts3ExprPhraseCount((Fts3Expr *)(ulong)in_stack_ffffffffffffffb0);
    local_10->nPhrase = iVar2;
    local_38.nPhrase = local_10->nPhrase;
    for (iVar2 = 0; local_18[iVar2] != '\0'; iVar2 = iVar2 + 1) {
      iVar3 = fts3MatchinfoSize(&local_38,local_18[iVar2]);
      iVar6 = iVar3 + iVar6;
    }
    sVar4 = strlen(local_18);
    iVar3 = (int)sVar4;
    puVar5 = (u32 *)sqlite3_malloc(iVar2);
    local_10->aMatchinfo = puVar5;
    if (local_10->aMatchinfo == (u32 *)0x0) {
      return 7;
    }
    local_10->zMatchinfo = (char *)(local_10->aMatchinfo + iVar6);
    local_10->nMatchinfo = iVar6;
    memcpy(local_10->zMatchinfo,local_18,(long)(iVar3 + 1));
    memset(local_10->aMatchinfo,0,(long)iVar6 << 2);
    local_10->isMatchinfoNeeded = 1;
  }
  local_38.aMatchinfo = local_10->aMatchinfo;
  local_38.nPhrase = local_10->nPhrase;
  if (local_10->isMatchinfoNeeded != 0) {
    local_44 = fts3MatchinfoValues((Fts3Cursor *)zArg,sInfo.aMatchinfo._4_4_,(MatchInfo *)sInfo.nDoc
                                   ,(char *)sInfo._8_8_);
    local_10->isMatchinfoNeeded = 0;
  }
  return local_44;
}

Assistant:

static int fts3GetMatchinfo(
  Fts3Cursor *pCsr,               /* FTS3 Cursor object */
  const char *zArg                /* Second argument to matchinfo() function */
){
  MatchInfo sInfo;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;
  int bGlobal = 0;                /* Collect 'global' stats as well as local */

  memset(&sInfo, 0, sizeof(MatchInfo));
  sInfo.pCursor = pCsr;
  sInfo.nCol = pTab->nColumn;

  /* If there is cached matchinfo() data, but the format string for the 
  ** cache does not match the format string for this request, discard 
  ** the cached data. */
  if( pCsr->zMatchinfo && strcmp(pCsr->zMatchinfo, zArg) ){
    assert( pCsr->aMatchinfo );
    sqlite3_free(pCsr->aMatchinfo);
    pCsr->zMatchinfo = 0;
    pCsr->aMatchinfo = 0;
  }

  /* If Fts3Cursor.aMatchinfo[] is NULL, then this is the first time the
  ** matchinfo function has been called for this query. In this case 
  ** allocate the array used to accumulate the matchinfo data and
  ** initialize those elements that are constant for every row.
  */
  if( pCsr->aMatchinfo==0 ){
    int nMatchinfo = 0;           /* Number of u32 elements in match-info */
    int nArg;                     /* Bytes in zArg */
    int i;                        /* Used to iterate through zArg */

    /* Determine the number of phrases in the query */
    pCsr->nPhrase = fts3ExprPhraseCount(pCsr->pExpr);
    sInfo.nPhrase = pCsr->nPhrase;

    /* Determine the number of integers in the buffer returned by this call. */
    for(i=0; zArg[i]; i++){
      nMatchinfo += fts3MatchinfoSize(&sInfo, zArg[i]);
    }

    /* Allocate space for Fts3Cursor.aMatchinfo[] and Fts3Cursor.zMatchinfo. */
    nArg = (int)strlen(zArg);
    pCsr->aMatchinfo = (u32 *)sqlite3_malloc(sizeof(u32)*nMatchinfo + nArg + 1);
    if( !pCsr->aMatchinfo ) return SQLITE_NOMEM;

    pCsr->zMatchinfo = (char *)&pCsr->aMatchinfo[nMatchinfo];
    pCsr->nMatchinfo = nMatchinfo;
    memcpy(pCsr->zMatchinfo, zArg, nArg+1);
    memset(pCsr->aMatchinfo, 0, sizeof(u32)*nMatchinfo);
    pCsr->isMatchinfoNeeded = 1;
    bGlobal = 1;
  }

  sInfo.aMatchinfo = pCsr->aMatchinfo;
  sInfo.nPhrase = pCsr->nPhrase;
  if( pCsr->isMatchinfoNeeded ){
    rc = fts3MatchinfoValues(pCsr, bGlobal, &sInfo, zArg);
    pCsr->isMatchinfoNeeded = 0;
  }

  return rc;
}